

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O0

uint __thiscall antlr::InputBuffer::mark(InputBuffer *this)

{
  InputBuffer *in_RDI;
  
  syncConsume(in_RDI);
  in_RDI->nMarkers = in_RDI->nMarkers + 1;
  return in_RDI->markerOffset;
}

Assistant:

unsigned int InputBuffer::mark()
{
	syncConsume();
	nMarkers++;
	return markerOffset;
}